

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O0

void __thiscall
amrex::NFilesIter::NFilesIter
          (NFilesIter *this,string *filename,Vector<int,_std::allocator<int>_> *readranks,
          bool setBuf)

{
  int iVar1;
  Long LVar2;
  int *piVar3;
  size_type __new_size;
  char *pcVar4;
  char *pcVar5;
  byte in_CL;
  string *in_RSI;
  int *in_RDI;
  int i;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  Vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_38;
  
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)(in_RDI + 0xe));
  Vector<char,_std::allocator<char>_>::Vector((Vector<char,_std::allocator<char>_> *)0x123f124);
  std::fstream::fstream(in_RDI + 0x1c);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x123f158);
  Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::Vector((Vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
            *)0x123f171);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x123f18a);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x123f1a3);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0x123f1bc);
  Vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::Vector
            ((Vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x123f1d5);
  *(undefined1 *)((long)in_RDI + 0x282) = 1;
  iVar1 = ParallelDescriptor::MyProc();
  *in_RDI = iVar1;
  iVar1 = ParallelDescriptor::NProcs();
  in_RDI[1] = iVar1;
  std::__cxx11::string::operator=((string *)(in_RDI + 6),in_RSI);
  Vector<int,_std::allocator<int>_>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  in_RDI[0xae] = -1;
  local_38 = 0;
  while( true ) {
    LVar2 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x123f274);
    if (LVar2 <= local_38) break;
    in_stack_ffffffffffffff64 = *in_RDI;
    piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                       (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38);
    if (in_stack_ffffffffffffff64 == *piVar3) {
      if (in_RDI[0xae] != -1) {
        Abort_host(in_stack_ffffffffffffff50);
      }
      in_RDI[0xae] = local_38;
    }
    local_38 = local_38 + 1;
  }
  if (in_RDI[0xae] == -1) {
    *(undefined1 *)((long)in_RDI + 0x283) = 1;
  }
  else {
    *(undefined1 *)((long)in_RDI + 0x283) = 0;
    if ((in_CL & 1) != 0) {
      __new_size = VisMFBuffer::GetIOBufferSize();
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),__new_size);
      pcVar4 = (char *)std::fstream::rdbuf();
      pcVar5 = Vector<char,_std::allocator<char>_>::dataPtr
                         ((Vector<char,_std::allocator<char>_> *)0x123f42e);
      Vector<char,_std::allocator<char>_>::size((Vector<char,_std::allocator<char>_> *)0x123f43c);
      std::streambuf::pubsetbuf(pcVar4,(long)pcVar5);
    }
    *(undefined1 *)(in_RDI + 0xaf) = 1;
  }
  return;
}

Assistant:

NFilesIter::NFilesIter(const std::string &filename,
                       const Vector<int> &readranks,
                       bool setBuf)
{
  isReading = true;
  myProc    = ParallelDescriptor::MyProc();
  nProcs    = ParallelDescriptor::NProcs();
  fullFileName = filename;
  readRanks = readranks;
  myReadIndex = indexUndefined;
  for(int i(0); i < readRanks.size(); ++i) {
    if(myProc == readRanks[i]) {
      if(myReadIndex != indexUndefined) {
        amrex::Abort("**** Error in NFilesIter:  readRanks not unique.");
      }
      myReadIndex = i;
    }
  }

  if(myReadIndex == indexUndefined) {  // ---- nothing to read
    finishedReading = true;
    return;
  } else {
    finishedReading = false;
  }

  if(setBuf) {
    io_buffer.resize(VisMFBuffer::GetIOBufferSize());
    fileStream.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
  }

  useStaticSetSelection = true;
}